

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

Token * errorToken(Token *__return_storage_ptr__,char *message)

{
  char *message_local;
  
  __return_storage_ptr__->type = TOKEN_ERROR;
  __return_storage_ptr__->start = message;
  __return_storage_ptr__->length = 0x15;
  __return_storage_ptr__->line = nkg.line;
  return __return_storage_ptr__;
}

Assistant:

static Token errorToken(const char* message) {
  Token token;
  token.type = TOKEN_ERROR;
  token.start = message;
  token.length = 21;
  token.line = nkg.line;

  return token;
}